

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  wostream *pwVar1;
  ostream *poVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  wstring test34;
  wstring input;
  string compressStr;
  wstring decompressWStr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> test;
  wstring compressWStr;
  LZString encoder;
  string decompressStr;
  wstring wStack_188;
  wstring local_168;
  string local_148;
  undefined4 *local_128;
  undefined8 local_120;
  undefined4 local_118 [4];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  wstring local_e8;
  wstring local_c8;
  LZString local_a8;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  if (argc == 2) {
    lzstring::LZString::LZString(&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,argv[1],(allocator<char> *)&local_e8);
    lzstring::to_wstring(&local_168,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    local_148._M_string_length = 0;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = L'\0';
    local_148.field_2._M_local_buf[0] = '\0';
    local_38 = local_28;
    local_30 = 0;
    local_128 = local_118;
    local_120 = 0;
    local_28[0] = 0;
    local_118[0] = 0;
    pwVar1 = std::operator<<((wostream *)&std::wcout,"str: ");
    pwVar1 = std::operator<<(pwVar1,(wstring *)&local_168);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,"[base64]");
    std::endl<char,std::char_traits<char>>(poVar2);
    lzstring::LZString::CompressToBase64((string *)&wStack_188,&local_a8,&local_168);
    std::__cxx11::string::operator=((string *)&local_148,(string *)&wStack_188);
    std::__cxx11::string::~string((string *)&wStack_188);
    lzstring::LZString::DeCompressFromBase64(&wStack_188,&local_a8,&local_148);
    std::__cxx11::wstring::operator=((wstring *)&local_128,(wstring *)&wStack_188);
    std::__cxx11::wstring::~wstring((wstring *)&wStack_188);
    poVar2 = std::operator<<((ostream *)&std::cout,"compress: ");
    poVar2 = std::operator<<(poVar2,(string *)&local_148);
    std::endl<char,std::char_traits<char>>(poVar2);
    pwVar1 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar1 = std::operator<<(pwVar1,(wstring *)&local_128);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,"origin size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"rate: ");
    auVar5._8_4_ = (int)(local_148._M_string_length >> 0x20);
    auVar5._0_8_ = local_148._M_string_length;
    auVar5._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)(local_168._M_string_length >> 0x20);
    auVar6._0_8_ = local_168._M_string_length;
    auVar6._12_4_ = 0x45300000;
    poVar2 = std::ostream::_M_insert<double>
                       (((auVar5._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_148._M_string_length) -
                        4503599627370496.0)) /
                        ((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_168._M_string_length) -
                        4503599627370496.0)));
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"[URI]");
    std::endl<char,std::char_traits<char>>(poVar2);
    lzstring::LZString::CompressToEncodedURIComponent((string *)&wStack_188,&local_a8,&local_168);
    std::__cxx11::string::operator=((string *)&local_148,(string *)&wStack_188);
    std::__cxx11::string::~string((string *)&wStack_188);
    lzstring::LZString::DeCompressFromEncodedURIComponent(&wStack_188,&local_a8,&local_148);
    std::__cxx11::wstring::operator=((wstring *)&local_128,(wstring *)&wStack_188);
    std::__cxx11::wstring::~wstring((wstring *)&wStack_188);
    poVar2 = std::operator<<((ostream *)&std::cout,"compress: ");
    poVar2 = std::operator<<(poVar2,(string *)&local_148);
    std::endl<char,std::char_traits<char>>(poVar2);
    pwVar1 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar1 = std::operator<<(pwVar1,(wstring *)&local_128);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,"origin size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"rate: ");
    auVar7._8_4_ = (int)(local_148._M_string_length >> 0x20);
    auVar7._0_8_ = local_148._M_string_length;
    auVar7._12_4_ = 0x45300000;
    auVar8._8_4_ = (int)(local_168._M_string_length >> 0x20);
    auVar8._0_8_ = local_168._M_string_length;
    auVar8._12_4_ = 0x45300000;
    poVar2 = std::ostream::_M_insert<double>
                       (((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_148._M_string_length) -
                        4503599627370496.0)) /
                        ((auVar8._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_168._M_string_length) -
                        4503599627370496.0)));
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"[UTF16]");
    std::endl<char,std::char_traits<char>>(poVar2);
    lzstring::LZString::CompressToUTF16(&wStack_188,&local_a8,&local_168);
    std::__cxx11::wstring::operator=((wstring *)&local_e8,(wstring *)&wStack_188);
    std::__cxx11::wstring::~wstring((wstring *)&wStack_188);
    lzstring::LZString::DeCompressFromUTF16(&wStack_188,&local_a8,&local_e8);
    std::__cxx11::wstring::operator=((wstring *)&local_128,(wstring *)&wStack_188);
    std::__cxx11::wstring::~wstring((wstring *)&wStack_188);
    pwVar1 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar1 = std::operator<<(pwVar1,(wstring *)&local_128);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,"origin size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"rate: ");
    auVar9._8_4_ = (int)(local_e8._M_string_length >> 0x20);
    auVar9._0_8_ = local_e8._M_string_length;
    auVar9._12_4_ = 0x45300000;
    auVar10._8_4_ = (int)(local_168._M_string_length >> 0x20);
    auVar10._0_8_ = local_168._M_string_length;
    auVar10._12_4_ = 0x45300000;
    poVar2 = std::ostream::_M_insert<double>
                       (((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_e8._M_string_length) -
                        4503599627370496.0)) /
                        ((auVar10._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_168._M_string_length) -
                        4503599627370496.0)));
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"[LZ String]");
    std::endl<char,std::char_traits<char>>(poVar2);
    lzstring::LZString::Compress(&wStack_188,&local_a8,&local_168);
    std::__cxx11::wstring::operator=((wstring *)&local_e8,(wstring *)&wStack_188);
    std::__cxx11::wstring::~wstring((wstring *)&wStack_188);
    lzstring::LZString::DeCompress(&wStack_188,&local_a8,&local_e8);
    std::__cxx11::wstring::operator=((wstring *)&local_128,(wstring *)&wStack_188);
    std::__cxx11::wstring::~wstring((wstring *)&wStack_188);
    pwVar1 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar1 = std::operator<<(pwVar1,(wstring *)&local_128);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,"origin size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"rate: ");
    auVar11._8_4_ = (int)(local_e8._M_string_length >> 0x20);
    auVar11._0_8_ = local_e8._M_string_length;
    auVar11._12_4_ = 0x45300000;
    auVar12._8_4_ = (int)(local_168._M_string_length >> 0x20);
    auVar12._0_8_ = local_168._M_string_length;
    auVar12._12_4_ = 0x45300000;
    poVar2 = std::ostream::_M_insert<double>
                       (((auVar11._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_e8._M_string_length) -
                        4503599627370496.0)) /
                        ((auVar12._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_168._M_string_length) -
                        4503599627370496.0)));
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"[LZ String uint8 array]");
    std::endl<char,std::char_traits<char>>(poVar2);
    local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lzstring::LZString::CompressToUint8Array
              (&local_a8,&local_168,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108);
    lzstring::LZString::DeCompressFromUint8Array_abi_cxx11_
              (&wStack_188,&local_a8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108);
    std::__cxx11::wstring::operator=((wstring *)&local_128,(wstring *)&wStack_188);
    std::__cxx11::wstring::~wstring((wstring *)&wStack_188);
    std::operator<<((ostream *)&std::cout,"compress: ");
    for (uVar4 = 0;
        uVar4 < (ulong)((long)local_108._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_108._M_impl.super__Vector_impl_data._M_start); uVar4 = uVar4 + 1)
    {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          (uint)local_108._M_impl.super__Vector_impl_data._M_start[uVar4]);
      std::operator<<(poVar2," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    pwVar1 = std::operator<<((wostream *)&std::wcout,"uncompress: ");
    pwVar1 = std::operator<<(pwVar1,(wstring *)&local_128);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
    poVar2 = std::operator<<((ostream *)&std::cout,"origin size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Compress size: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"rate: ");
    lVar3 = (long)local_108._M_impl.super__Vector_impl_data._M_finish -
            (long)local_108._M_impl.super__Vector_impl_data._M_start;
    auVar13._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar13._0_8_ = lVar3;
    auVar13._12_4_ = 0x45300000;
    auVar14._8_4_ = (int)(local_168._M_string_length >> 0x20);
    auVar14._0_8_ = local_168._M_string_length;
    auVar14._12_4_ = 0x45300000;
    poVar2 = std::ostream::_M_insert<double>
                       (((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                        ((auVar14._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)local_168._M_string_length) -
                        4503599627370496.0)));
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"-------------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&wStack_188,L"😘",(allocator<wchar_t> *)&local_c8);
    lzstring::LZString::CompressToBase64((string *)&local_c8,&local_a8,&wStack_188);
    std::__cxx11::string::operator=((string *)&local_148,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    lzstring::LZString::DeCompressFromBase64(&local_c8,&local_a8,&local_148);
    std::__cxx11::wstring::operator=((wstring *)&local_128,(wstring *)&local_c8);
    std::__cxx11::wstring::~wstring((wstring *)&local_c8);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_148);
    std::endl<char,std::char_traits<char>>(poVar2);
    pwVar1 = std::operator<<((wostream *)&std::wcout,(wstring *)&local_128);
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
    system("PAUSE");
    std::__cxx11::wstring::~wstring((wstring *)&wStack_188);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
    std::__cxx11::wstring::~wstring((wstring *)&local_128);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::wstring::~wstring((wstring *)&local_e8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::wstring::~wstring((wstring *)&local_168);
    lzstring::LZString::~LZString(&local_a8);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc == 2)
  {
    lzstring::LZString encoder;
    std::wstring input(lzstring::to_wstring(argv[1]));
    std::string compressStr;
    std::wstring compressWStr;
    std::string decompressStr;
    std::wstring decompressWStr;

    std::wcout << "str: " << input << std::endl;

    std::cout << "[base64]" << std::endl;
    compressStr = encoder.CompressToBase64(input);
    decompressWStr = encoder.DeCompressFromBase64(compressStr);
    std::cout << "compress: " << compressStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressStr.size() << std::endl;
    std::cout << "rate: " << (double(compressStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[URI]" << std::endl;
    compressStr = encoder.CompressToEncodedURIComponent(input);
    decompressWStr = encoder.DeCompressFromEncodedURIComponent(compressStr);
    std::cout << "compress: " << compressStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressStr.size() << std::endl;
    std::cout << "rate: " << (double(compressStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[UTF16]" << std::endl;
    compressWStr = encoder.CompressToUTF16(input);
    decompressWStr = encoder.DeCompressFromUTF16(compressWStr);
    //std::wcout << "compress: " << compressWStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressWStr.size() << std::endl;
    std::cout << "rate: " << (double(compressWStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[LZ String]" << std::endl;
    compressWStr = encoder.Compress(input);
    decompressWStr = encoder.DeCompress(compressWStr);
    //std::wcout << "compress: " << compressWStr << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << compressWStr.size() << std::endl;
    std::cout << "rate: " << (double(compressWStr.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::cout << "[LZ String uint8 array]" << std::endl;
    std::vector<uint8_t> test;
    encoder.CompressToUint8Array(input, test);
    decompressWStr = encoder.DeCompressFromUint8Array(test);
    std::cout << "compress: ";
    for (size_t i = 0; i < test.size(); i++)
    {
      std::cout << (int)test[i] << " ";
    }
    std::cout << std::endl;
    std::wcout << "uncompress: " << decompressWStr << std::endl;
    std::cout << "origin size: " << input.size() << std::endl;
    std::cout << "Compress size: " << test.size() << std::endl;
    std::cout << "rate: " << (double(test.size())) / input.size() << std::endl;

    std::cout << "-------------------------------------------" << std::endl;
    std::wstring test34 = L"😘";
    compressStr = encoder.CompressToBase64(test34);
    decompressWStr = encoder.DeCompressFromBase64(compressStr);
    std::cout << compressStr << std::endl;
    std::wcout << decompressWStr << std::endl;
    system("PAUSE");
  }
}